

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  IRIns *pIVar1;
  IRIns *ir;
  IRRef ref;
  GCtrace *T_local;
  global_State *g_local;
  
  if (T->traceno != 0) {
    for (ir._4_4_ = T->nk; ir._4_4_ < 0x7ffd; ir._4_4_ = ir._4_4_ + 1) {
      pIVar1 = T->ir;
      if (((&pIVar1->field_1)[ir._4_4_].o == '\x18') &&
         ((*(byte *)((long)pIVar1[(ulong)ir._4_4_ + 1] + 8) & 3) != 0)) {
        gc_mark(g,(GCobj *)pIVar1[(ulong)ir._4_4_ + 1]);
      }
      if (((0x605fd9U >> ((&pIVar1->field_1)[ir._4_4_].t.irt & 0x1f) & 1) != 0) &&
         ((&pIVar1->field_1)[ir._4_4_].o != '\x1b')) {
        ir._4_4_ = ir._4_4_ + 1;
      }
    }
    if (T->link != 0) {
      gc_marktrace(g,(uint)T->link);
    }
    if (T->nextroot != 0) {
      gc_marktrace(g,(uint)T->nextroot);
    }
    if (T->nextside != 0) {
      gc_marktrace(g,(uint)T->nextside);
    }
    if ((*(byte *)((T->startpt).gcptr64 + 8) & 3) != 0) {
      gc_mark(g,(GCobj *)(T->startpt).gcptr64);
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
    if (irt_is64(ir->t) && ir->o != IR_KNULL)
      ref++;
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}